

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3ExprIsInteger(Expr *p,int *pValue,Parse *pParse)

{
  char cVar1;
  long lVar2;
  char cVar3;
  char cVar4;
  int iVar5;
  sqlite3_value *pVal_00;
  ulong uVar6;
  undefined4 uVar7;
  long *in_RDX;
  Expr *in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  sqlite3_int64 vv;
  sqlite3_value *pVal;
  int rc;
  int v;
  undefined8 in_stack_ffffffffffffffc0;
  Vdbe *v_00;
  uint in_stack_ffffffffffffffd0;
  int local_10;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = 0;
  if (in_RDI == (char *)0x0) {
    local_10 = 0;
  }
  else if ((*(uint *)(in_RDI + 4) & 0x800) == 0) {
    cVar1 = *in_RDI;
    if (cVar1 == -99) {
      v_00 = (Vdbe *)&DAT_aaaaaaaaaaaaaaaa;
      if (((in_RDX != (long *)0x0) && (in_RDX[2] != 0)) &&
         ((*(ulong *)(*in_RDX + 0x30) & 0x800000) == 0)) {
        sqlite3VdbeSetVarmask((Vdbe *)in_RDX[2],(int)*(short *)(in_RDI + 0x30));
        pVal_00 = sqlite3VdbeGetBoundValue
                            (v_00,(int)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                             (u8)((ulong)in_stack_ffffffffffffffc0 >> 0x18));
        if (pVal_00 != (sqlite3_value *)0x0) {
          iVar5 = sqlite3_value_type(pVal_00);
          if ((iVar5 == 1) &&
             (uVar6 = sqlite3_value_int64((sqlite3_value *)0x1d1802), uVar6 == (uVar6 & 0x7fffffff))
             ) {
            uVar7 = (undefined4)uVar6;
            in_RSI->op = (char)uVar7;
            in_RSI->affExpr = (char)((uint)uVar7 >> 8);
            in_RSI->op2 = (char)((uint)uVar7 >> 0x10);
            in_RSI->field_0x3 = (char)((uint)uVar7 >> 0x18);
            local_10 = 1;
          }
          sqlite3ValueFree((sqlite3_value *)0x1d183f);
        }
      }
    }
    else if (cVar1 == -0x53) {
      local_10 = sqlite3ExprIsInteger
                           (in_RSI,(int *)in_RDX,(Parse *)(ulong)in_stack_ffffffffffffffd0);
    }
    else if ((cVar1 == -0x52) &&
            (iVar5 = sqlite3ExprIsInteger
                               (in_RSI,(int *)in_RDX,(Parse *)(ulong)in_stack_ffffffffffffffd0),
            iVar5 != 0)) {
      in_RSI->op = '\0';
      in_RSI->affExpr = '\0';
      in_RSI->op2 = '\0';
      in_RSI->field_0x3 = 0;
      local_10 = 1;
    }
  }
  else {
    cVar1 = in_RDI[9];
    cVar3 = in_RDI[10];
    cVar4 = in_RDI[0xb];
    in_RSI->op = in_RDI[8];
    in_RSI->affExpr = cVar1;
    in_RSI->op2 = cVar3;
    in_RSI->field_0x3 = cVar4;
    local_10 = 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return local_10;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprIsInteger(const Expr *p, int *pValue, Parse *pParse){
  int rc = 0;
  if( NEVER(p==0) ) return 0;  /* Used to only happen following on OOM */

  /* If an expression is an integer literal that fits in a signed 32-bit
  ** integer, then the EP_IntValue flag will have already been set */
  assert( p->op!=TK_INTEGER || (p->flags & EP_IntValue)!=0
           || sqlite3GetInt32(p->u.zToken, &rc)==0 );

  if( p->flags & EP_IntValue ){
    *pValue = p->u.iValue;
    return 1;
  }
  switch( p->op ){
    case TK_UPLUS: {
      rc = sqlite3ExprIsInteger(p->pLeft, pValue, 0);
      break;
    }
    case TK_UMINUS: {
      int v = 0;
      if( sqlite3ExprIsInteger(p->pLeft, &v, 0) ){
        assert( ((unsigned int)v)!=0x80000000 );
        *pValue = -v;
        rc = 1;
      }
      break;
    }
    case TK_VARIABLE: {
      sqlite3_value *pVal;
      if( pParse==0 ) break;
      if( NEVER(pParse->pVdbe==0) ) break;
      if( (pParse->db->flags & SQLITE_EnableQPSG)!=0 ) break;
      sqlite3VdbeSetVarmask(pParse->pVdbe, p->iColumn);
      pVal = sqlite3VdbeGetBoundValue(pParse->pReprepare, p->iColumn,
                                      SQLITE_AFF_BLOB);
      if( pVal ){
        if( sqlite3_value_type(pVal)==SQLITE_INTEGER ){
          sqlite3_int64 vv = sqlite3_value_int64(pVal);
          if( vv == (vv & 0x7fffffff) ){ /* non-negative numbers only */
            *pValue = (int)vv;
            rc = 1;
          }
        }
        sqlite3ValueFree(pVal);
      }
      break;
    }
    default: break;
  }
  return rc;
}